

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O1

void __thiscall MeasurementToString_simple_Test::TestBody(MeasurementToString_simple_Test *this)

{
  precise_measurement *measure;
  measurement *measure_00;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  measurement meas;
  precise_measurement pm;
  AssertHelper local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  undefined1 *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_38 = &DAT_4046800000000000;
  local_30 = 0x3ff0000000000000;
  uStack_28 = 1;
  measure = (precise_measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_70;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_38,measure,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&local_50,"to_string(pm)","\"45 m\"",__return_storage_ptr__,
             (char (*) [5])"45 m");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (string *)0x49;
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = &DAT_4046800000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13f800000;
  measure_00 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            (&local_70,(units *)&local_50,measure_00,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&local_80,"to_string(meas)","\"45 m\"",&local_70,(char (*) [5])"45 m");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  return;
}

Assistant:

TEST(MeasurementToString, simple)
{
    auto pm = precise_measurement(45.0, precise::m);
    EXPECT_EQ(to_string(pm), "45 m");
    auto meas = 45.0 * m;
    EXPECT_EQ(to_string(meas), "45 m");
}